

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# cuddGroup.c
# Opt level: O3

int ddGroupMove(DdManager *table,int x,int y,Move **moves)

{
  Move *pMVar1;
  Move *pMVar2;
  int iVar3;
  uint uVar4;
  uint uVar5;
  uint uVar6;
  DdNode *pDVar7;
  int iVar8;
  int iVar9;
  DdHalfWord y_00;
  int iVar10;
  DdHalfWord x_00;
  int iVar11;
  int iVar12;
  DdHalfWord x_01;
  bool bVar13;
  
  uVar6 = table->subtables[x].next;
  uVar4 = y;
  do {
    uVar5 = uVar4;
    uVar4 = table->subtables[(int)uVar5].next;
  } while (uVar5 < uVar4);
  iVar11 = x - uVar6;
  iVar8 = uVar5 - y;
  uVar4 = uVar6;
  if (iVar8 < 0) {
    y_00 = 0xffffffff;
    x_01 = 0xffffffff;
  }
  else {
    iVar9 = x - uVar6;
    y_00 = 0xffffffff;
    x_01 = 0xffffffff;
    x_00 = y;
    iVar10 = 1;
    do {
      iVar12 = iVar9 + 1;
      if (-1 < iVar11) {
        do {
          x_01 = x;
          y_00 = x_00;
          iVar3 = cuddSwapInPlace(table,x_01,y_00);
          if (iVar3 == 0) goto LAB_009311d3;
          x = cuddNextLow(table,x_01);
          iVar12 = iVar12 + -1;
          x_00 = x_01;
        } while (iVar12 != 0);
      }
      x_00 = y + iVar10;
      x = cuddNextLow(table,x_00);
      bVar13 = iVar10 != (uVar5 - y) + 1;
      iVar10 = iVar10 + 1;
    } while (bVar13);
    if (uVar5 != y) {
      do {
        uVar5 = cuddNextHigh(table,uVar4);
        table->subtables[(int)uVar4].next = uVar5;
        uVar4 = cuddNextHigh(table,uVar4);
        iVar8 = iVar8 + -1;
      } while (iVar8 != 0);
    }
  }
  table->subtables[(int)uVar4].next = uVar6;
  uVar4 = cuddNextHigh(table,uVar4);
  uVar6 = uVar4;
  if (0 < iVar11) {
    do {
      uVar5 = cuddNextHigh(table,uVar6);
      table->subtables[(int)uVar6].next = uVar5;
      uVar6 = cuddNextHigh(table,uVar6);
      iVar11 = iVar11 + -1;
    } while (iVar11 != 0);
  }
  table->subtables[(int)uVar6].next = uVar4;
  pDVar7 = cuddDynamicAllocNode(table);
  if (pDVar7 == (DdNode *)0x0) {
LAB_009311d3:
    iVar8 = 0;
    pMVar2 = *moves;
    while (pMVar2 != (Move *)0x0) {
      pMVar1 = pMVar2->next;
      pMVar2->y = 0;
      *(DdNode **)&pMVar2->flags = table->nextFree;
      table->nextFree = (DdNode *)*moves;
      *moves = pMVar1;
      pMVar2 = pMVar1;
    }
  }
  else {
    pDVar7->index = x_01;
    pDVar7->ref = y_00;
    *(undefined4 *)&pDVar7->next = 0;
    iVar8 = table->keys - table->isolated;
    *(int *)((long)&pDVar7->next + 4) = iVar8;
    (pDVar7->type).kids.T = (DdNode *)*moves;
    *moves = (Move *)pDVar7;
  }
  return iVar8;
}

Assistant:

static int
ddGroupMove(
  DdManager * table,
  int  x,
  int  y,
  Move ** moves)
{
    Move *move;
    int  size;
    int  i,j,xtop,xbot,xsize,ytop,ybot,ysize,newxtop;
    int  swapx = -1,swapy = -1;
#if defined(DD_DEBUG) && defined(DD_VERBOSE)
    int  initialSize,bestSize;
#endif

#ifdef DD_DEBUG
    /* We assume that x < y */
    assert(x < y);
#endif
    /* Find top, bottom, and size for the two groups. */
    xbot = x;
    xtop = table->subtables[x].next;
    xsize = xbot - xtop + 1;
    ybot = y;
    while ((unsigned) ybot < table->subtables[ybot].next)
        ybot = table->subtables[ybot].next;
    ytop = y;
    ysize = ybot - ytop + 1;

#if defined(DD_DEBUG) && defined(DD_VERBOSE)
    initialSize = bestSize = table->keys - table->isolated;
#endif
    /* Sift the variables of the second group up through the first group */
    for (i = 1; i <= ysize; i++) {
        for (j = 1; j <= xsize; j++) {
            size = cuddSwapInPlace(table,x,y);
            if (size == 0) goto ddGroupMoveOutOfMem;
#if defined(DD_DEBUG) && defined(DD_VERBOSE)
            if (size < bestSize)
                bestSize = size;
#endif
            swapx = x; swapy = y;
            y = x;
            x = cuddNextLow(table,y);
        }
        y = ytop + i;
        x = cuddNextLow(table,y);
    }
#if defined(DD_DEBUG) && defined(DD_VERBOSE)
    if ((bestSize < initialSize) && (bestSize < size))
        (void) fprintf(table->out,"Missed local minimum: initialSize:%d  bestSize:%d  finalSize:%d\n",initialSize,bestSize,size);
#endif

    /* fix groups */
    y = xtop; /* ytop is now where xtop used to be */
    for (i = 0; i < ysize - 1; i++) {
        table->subtables[y].next = cuddNextHigh(table,y);
        y = cuddNextHigh(table,y);
    }
    table->subtables[y].next = xtop; /* y is bottom of its group, join */
                                    /* it to top of its group */
    x = cuddNextHigh(table,y);
    newxtop = x;
    for (i = 0; i < xsize - 1; i++) {
        table->subtables[x].next = cuddNextHigh(table,x);
        x = cuddNextHigh(table,x);
    }
    table->subtables[x].next = newxtop; /* x is bottom of its group, join */
                                    /* it to top of its group */
#ifdef DD_DEBUG
    if (pr > 0) (void) fprintf(table->out,"ddGroupMove:\n");
#endif

    /* Store group move */
    move = (Move *) cuddDynamicAllocNode(table);
    if (move == NULL) goto ddGroupMoveOutOfMem;
    move->x = swapx;
    move->y = swapy;
    move->flags = MTR_DEFAULT;
    move->size = table->keys - table->isolated;
    move->next = *moves;
    *moves = move;

    return(table->keys - table->isolated);

ddGroupMoveOutOfMem:
    while (*moves != NULL) {
        move = (*moves)->next;
        cuddDeallocMove(table, *moves);
        *moves = move;
    }
    return(0);

}